

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O2

int WildMidi_Init(char *config_file,unsigned_short rate,unsigned_short options)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  uint uVar4;
  
  if (WM_Initialized == '\x01') {
    iVar1 = 10;
    uVar4 = 0x9f7;
    pcVar3 = (char *)0x0;
  }
  else {
    if (config_file != (char *)0x0) {
      for (lVar2 = 0; lVar2 != 0x400; lVar2 = lVar2 + 8) {
        *(undefined8 *)((long)patch + lVar2) = 0;
      }
      iVar1 = WM_LoadConfig(config_file);
      if (iVar1 == -1) {
        return -1;
      }
      if ((options & 0x5ff8) == 0) {
        if (0x2b10 < rate) {
          _WM_SampleRate = rate;
          WM_Initialized = 1;
          WM_MixerOptions = options;
          return 0;
        }
        pcVar3 = "(rate out of bounds, range is 11025 - 65535)";
        uVar4 = 0xa0e;
        WM_MixerOptions = options;
      }
      else {
        pcVar3 = "(invalid option)";
        uVar4 = 0xa06;
      }
      _WM_ERROR("WildMidi_Init",uVar4,9,pcVar3,0);
      WM_FreePatches();
      return -1;
    }
    pcVar3 = "(NULL config file pointer)";
    iVar1 = 9;
    uVar4 = 0x9fc;
  }
  _WM_ERROR("WildMidi_Init",uVar4,iVar1,pcVar3,0);
  return -1;
}

Assistant:

WM_SYMBOL int WildMidi_Init(const char * config_file, unsigned short int rate,
		unsigned short int options) {
	if (WM_Initialized) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_ALR_INIT, NULL, 0);
		return -1;
	}

	if (config_file == NULL) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_INVALID_ARG,
				"(NULL config file pointer)", 0);
		return -1;
	}
	WM_InitPatches();
	if (WM_LoadConfig(config_file) == -1) {
		return -1;
	}

	if (options & 0x5FF8) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_INVALID_ARG, "(invalid option)",
				0);
		WM_FreePatches();
		return -1;
	}
	WM_MixerOptions = options;

	if (rate < 11025) {
		_WM_ERROR(__FUNCTION__, __LINE__, WM_ERR_INVALID_ARG,
				"(rate out of bounds, range is 11025 - 65535)", 0);
		WM_FreePatches();
		return -1;
	}
	_WM_SampleRate = rate;
	WM_Initialized = 1;

	return 0;
}